

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
               (CodedInputStream *input,RepeatedField<bool> *values)

{
  uint8 *puVar1;
  Limit limit;
  unsigned_long uVar2;
  int iVar3;
  pair<unsigned_long,_bool> pVar4;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (iVar3 = (int)(char)*puVar1, -1 < (char)*puVar1)) {
    input->buffer_ = puVar1 + 1;
  }
  else {
    iVar3 = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    if (iVar3 < 0) {
      return false;
    }
  }
  limit = io::CodedInputStream::PushLimit(input,iVar3);
  do {
    iVar3 = io::CodedInputStream::BytesUntilLimit(input);
    if (iVar3 < 1) {
      io::CodedInputStream::PopLimit(input,limit);
      return true;
    }
    puVar1 = input->buffer_;
    if ((puVar1 < input->buffer_end_) && (uVar2 = (unsigned_long)(char)*puVar1, -1 < (long)uVar2)) {
      input->buffer_ = puVar1 + 1;
    }
    else {
      pVar4 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar2 = pVar4.first;
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    iVar3 = values->current_size_;
    if (iVar3 == values->total_size_) {
      RepeatedField<bool>::Reserve(values,iVar3 + 1);
      iVar3 = values->current_size_;
    }
    values->current_size_ = iVar3 + 1;
    values->rep_->elements[iVar3] = uVar2 != 0;
  } while( true );
}

Assistant:

inline bool WireFormatLite::ReadPackedPrimitive(io::CodedInputStream* input,
                                                RepeatedField<CType>* values) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    CType value;
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->Add(value);
  }
  input->PopLimit(limit);
  return true;
}